

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlNodeGetBase(xmlDoc *doc,xmlNode *cur)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  bool bVar4;
  xmlEntityPtr ent;
  xmlChar *newbase;
  xmlChar *base;
  xmlChar *oldbase;
  xmlNode *cur_local;
  xmlDoc *doc_local;
  
  base = (xmlChar *)0x0;
  if ((cur == (xmlNode *)0x0) && (doc == (xmlDoc *)0x0)) {
    doc_local = (xmlDoc *)0x0;
  }
  else if ((cur == (xmlNode *)0x0) || (cur->type != XML_NAMESPACE_DECL)) {
    cur_local = (xmlNode *)doc;
    if (doc == (xmlDoc *)0x0) {
      cur_local = (xmlNode *)cur->doc;
    }
    oldbase = (xmlChar *)cur;
    if ((cur_local == (xmlNode *)0x0) || (cur_local->type != XML_HTML_DOCUMENT_NODE)) {
      for (; oldbase != (xmlChar *)0x0; oldbase = *(xmlChar **)(oldbase + 0x28)) {
        if (*(int *)(oldbase + 8) == 0x11) {
          pxVar2 = xmlStrdup(*(xmlChar **)(oldbase + 0x78));
          return pxVar2;
        }
        if ((*(int *)(oldbase + 8) == 1) &&
           (pxVar2 = xmlGetNsProp((xmlNode *)oldbase,"base",
                                  (xmlChar *)"http://www.w3.org/XML/1998/namespace"),
           pxVar2 != (xmlChar *)0x0)) {
          if (base != (xmlChar *)0x0) {
            pxVar3 = xmlBuildURI(base,pxVar2);
            if (pxVar3 == (xmlChar *)0x0) {
              (*xmlFree)(base);
              (*xmlFree)(pxVar2);
              return (xmlChar *)0x0;
            }
            (*xmlFree)(base);
            (*xmlFree)(pxVar2);
            pxVar2 = pxVar3;
          }
          base = pxVar2;
          iVar1 = xmlStrncmp(base,(xmlChar *)"http://",7);
          if (((iVar1 == 0) || (iVar1 = xmlStrncmp(base,(xmlChar *)"ftp://",6), iVar1 == 0)) ||
             (iVar1 = xmlStrncmp(base,(xmlChar *)"urn:",4), iVar1 == 0)) {
            return base;
          }
        }
      }
      if ((cur_local == (xmlNode *)0x0) || (cur_local[1].name == (xmlChar *)0x0)) {
        doc_local = (xmlDoc *)base;
      }
      else if (base == (xmlChar *)0x0) {
        doc_local = (xmlDoc *)xmlStrdup(cur_local[1].name);
      }
      else {
        doc_local = (xmlDoc *)xmlBuildURI(base,cur_local[1].name);
        (*xmlFree)(base);
      }
    }
    else {
      oldbase = (xmlChar *)cur_local->children;
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              bVar4 = false;
              if (oldbase != (xmlChar *)0x0) {
                bVar4 = *(long *)(oldbase + 0x10) != 0;
              }
              if (!bVar4) {
                return (xmlChar *)0x0;
              }
              if (*(int *)(oldbase + 8) == 1) break;
              oldbase = *(xmlChar **)(oldbase + 0x30);
            }
            iVar1 = xmlStrcasecmp(*(xmlChar **)(oldbase + 0x10),"html");
            if (iVar1 != 0) break;
            oldbase = *(xmlChar **)(oldbase + 0x18);
          }
          iVar1 = xmlStrcasecmp(*(xmlChar **)(oldbase + 0x10),"head");
          if (iVar1 != 0) break;
          oldbase = *(xmlChar **)(oldbase + 0x18);
        }
        iVar1 = xmlStrcasecmp(*(xmlChar **)(oldbase + 0x10),"base");
        if (iVar1 == 0) break;
        oldbase = *(xmlChar **)(oldbase + 0x30);
      }
      doc_local = (xmlDoc *)xmlGetProp((xmlNode *)oldbase,"href");
    }
  }
  else {
    doc_local = (xmlDoc *)0x0;
  }
  return (xmlChar *)doc_local;
}

Assistant:

xmlChar *
xmlNodeGetBase(const xmlDoc *doc, const xmlNode *cur) {
    xmlChar *oldbase = NULL;
    xmlChar *base, *newbase;

    if ((cur == NULL) && (doc == NULL))
        return(NULL);
    if ((cur != NULL) && (cur->type == XML_NAMESPACE_DECL))
        return(NULL);
    if (doc == NULL) doc = cur->doc;
    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        cur = doc->children;
	while ((cur != NULL) && (cur->name != NULL)) {
	    if (cur->type != XML_ELEMENT_NODE) {
	        cur = cur->next;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "html")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "head")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "base")) {
                return(xmlGetProp(cur, BAD_CAST "href"));
	    }
	    cur = cur->next;
	}
	return(NULL);
    }
    while (cur != NULL) {
	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr ent = (xmlEntityPtr) cur;
	    return(xmlStrdup(ent->URI));
	}
	if (cur->type == XML_ELEMENT_NODE) {
	    base = xmlGetNsProp(cur, BAD_CAST "base", XML_XML_NAMESPACE);
	    if (base != NULL) {
		if (oldbase != NULL) {
		    newbase = xmlBuildURI(oldbase, base);
		    if (newbase != NULL) {
			xmlFree(oldbase);
			xmlFree(base);
			oldbase = newbase;
		    } else {
			xmlFree(oldbase);
			xmlFree(base);
			return(NULL);
		    }
		} else {
		    oldbase = base;
		}
		if ((!xmlStrncmp(oldbase, BAD_CAST "http://", 7)) ||
		    (!xmlStrncmp(oldbase, BAD_CAST "ftp://", 6)) ||
		    (!xmlStrncmp(oldbase, BAD_CAST "urn:", 4)))
		    return(oldbase);
	    }
	}
	cur = cur->parent;
    }
    if ((doc != NULL) && (doc->URL != NULL)) {
	if (oldbase == NULL)
	    return(xmlStrdup(doc->URL));
	newbase = xmlBuildURI(oldbase, doc->URL);
	xmlFree(oldbase);
	return(newbase);
    }
    return(oldbase);
}